

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flying_cheat.cc
# Opt level: O0

void __thiscall Player::CanJump(Player *this)

{
  CanJump(this + -0xa8);
  return;
}

Assistant:

bool Player::CanJump()
{
    // Check if cheat is active
    if (!cheats) {
        std::cerr << "Cheats map not initialized" << std::endl;
        exit(1);
    }
    auto cheat = cheats->find(module_name);
    if (cheat == cheats->end()) {
        std::cerr << "Cheat not registered" << std::endl;
        exit(1);
    }

    // Always allow jump if active
    if (cheat->second->active) {
        return true;
    }

    // Call the original function
    bool (*can_jump)(Player *) = (bool (*)(Player *))dlsym(RTLD_NEXT, "_ZN6Player7CanJumpEv");
    if (can_jump != NULL) {
        return can_jump(this);
    }

    return true;
}